

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall Matrix::SwapRows(Matrix *this,int first_row,int second_row)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  
  if ((first_row == second_row) || (this->m_ < 1)) {
    bVar6 = false;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    bVar6 = false;
    do {
      pvVar1 = (this->elements_).
               super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = operator!=((Fraction *)
                         (*(long *)&pvVar1[first_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar8),
                         (Fraction *)
                         (*(long *)&pvVar1[second_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar8));
      if (bVar5) {
        pvVar1 = (this->elements_).
                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = *(long *)&pvVar1[first_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                          _M_impl.super__Vector_impl_data;
        lVar3 = *(long *)&pvVar1[second_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>
                          ._M_impl.super__Vector_impl_data;
        uVar4 = *(undefined8 *)(lVar2 + lVar8);
        *(undefined8 *)(lVar2 + lVar8) = *(undefined8 *)(lVar3 + lVar8);
        *(undefined8 *)(lVar3 + lVar8) = uVar4;
        bVar6 = true;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar7 < this->m_);
  }
  return bVar6;
}

Assistant:

bool Matrix::SwapRows(int first_row, int second_row) {
  if (first_row == second_row) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[first_row][column] != elements_[second_row][column]) {
      result = true;
      std::swap(elements_[first_row][column], elements_[second_row][column]);
    }
  }

  return result;
}